

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

int lws_cache_heap_invalidate(lws_cache_ttl_lru *_c,char *specific_key)

{
  lws_dll2 *plVar1;
  int iVar2;
  lws_cache_ttl_item_heap_t *item_00;
  char *pcVar3;
  char *iname;
  lws_cache_ttl_item_heap_t *i;
  lws_dll2 *d1;
  lws_dll2 *d;
  size_t size;
  void *user;
  lws_cache_ttl_item_heap_t *item;
  lws_cache_ttl_lru *backing;
  lws_cache_ttl_lru_t_heap_t *cache;
  char *specific_key_local;
  lws_cache_ttl_lru *_c_local;
  
  item = (lws_cache_ttl_item_heap_t *)_c;
  backing = _c;
  cache = (lws_cache_ttl_lru_t_heap_t *)specific_key;
  specific_key_local = (char *)_c;
  iVar2 = lws_cache_heap_get(_c,specific_key,(void **)&size,(size_t *)&d);
  if (iVar2 == 0) {
    if ((item->list_lru).prev != (lws_dll2 *)0x0) {
      item = (lws_cache_ttl_item_heap_t *)(item->list_lru).prev;
    }
    user = (void *)(size - 0x48);
    d1 = (lws_dll2 *)backing[1].info.ops;
    while (d1 != (lws_dll2 *)0x0) {
      plVar1 = d1->next;
      item_00 = (lws_cache_ttl_item_heap_t *)(d1 + -1);
      pcVar3 = (char *)((long)&(d1[1].owner)->tail + (long)&d1[2].prev);
      d1 = plVar1;
      if ((*pcVar3 == '!') &&
         (iVar2 = (*(code *)(item->list_lru).next[1].next)(item,pcVar3 + 1,cache,1), iVar2 == 0)) {
        _lws_cache_heap_item_destroy((lws_cache_ttl_lru_t_heap_t *)backing,item_00);
      }
    }
    lws_cache_heap_item_destroy
              ((lws_cache_ttl_lru_t_heap_t *)backing,(lws_cache_ttl_item_heap_t *)user,0);
  }
  return 0;
}

Assistant:

static int
lws_cache_heap_invalidate(struct lws_cache_ttl_lru *_c, const char *specific_key)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	struct lws_cache_ttl_lru *backing = _c;
	lws_cache_ttl_item_heap_t *item;
	const void *user;
	size_t size;

	if (lws_cache_heap_get(_c, specific_key, &user, &size))
		return 0;

	if (backing->info.parent)
		backing = backing->info.parent;

	item = (lws_cache_ttl_item_heap_t *)(((uint8_t *)user) - sizeof(*item));

	/*
	 * We must invalidate any cached results that would have included this
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   cache->items_lru.head) {
		lws_cache_ttl_item_heap_t *i = lws_container_of(d,
						lws_cache_ttl_item_heap_t,
						list_lru);
		const char *iname = ((const char *)&i[1]) + i->size;

		if (*iname == META_ITEM_LEADING) {

			/*
			 * If the item about to be added would match any cached
			 * results from before it was added, we have to
			 * invalidate them.  To check this, we have to use the
			 * matching rules at the backing store level
			 */

			if (!backing->info.ops->tag_match(backing, iname + 1,
							  specific_key, 1))
				_lws_cache_heap_item_destroy(cache, i);
		}

	} lws_end_foreach_dll_safe(d, d1);

	lws_cache_heap_item_destroy(cache, item, 0);

	return 0;
}